

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renaming.cpp
# Opt level: O3

TypedTermList __thiscall Kernel::Renaming::normalize(Renaming *this,TypedTermList l)

{
  TermList t;
  byte bVar1;
  TypedTermList TVar2;
  Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> n;
  Applicator a;
  Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_30;
  Applicator local_20;
  
  t = l.super_TermList._content;
  if (((ulong)this & 3) == 0) {
    this = (Renaming *)normalize((Term *)this);
    t = SortHelper::getResultSort((Term *)this);
  }
  else {
    Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
              (&local_30);
    normalizeVariables((Renaming *)
                       local_30._self._M_t.
                       super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>
                       .super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl,(TermList)this
                      );
    normalizeVariables((Renaming *)
                       local_30._self._M_t.
                       super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>
                       .super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl,t);
    bVar1 = *(bool *)((long)local_30._self._M_t.
                            super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>
                            .super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl + 0x2c);
    if ((bool)bVar1 == false) {
      local_20._parent =
           (Renaming *)
           local_30._self._M_t.
           super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>._M_t.
           super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>.
           super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl;
      this = (Renaming *)
             SubstHelper::applyImpl<false,Kernel::Renaming::Applicator>
                       ((TermList)this,&local_20,false);
      bVar1 = *(bool *)((long)local_30._self._M_t.
                              super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>
                              .super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl + 0x2c)
      ;
    }
    if ((bVar1 & 1) == 0) {
      local_20._parent =
           (Renaming *)
           local_30._self._M_t.
           super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>._M_t.
           super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>.
           super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl;
      t = SubstHelper::applyImpl<false,Kernel::Renaming::Applicator>(t,&local_20,false);
    }
    Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
              (&local_30);
  }
  TVar2._sort._content = t._content;
  TVar2.super_TermList._content = (uint64_t)this;
  return TVar2;
}

Assistant:

TypedTermList Renaming::normalize(TypedTermList l)
{
  if (l.isTerm()) {
    return TypedTermList(normalize(l.term()));
  } else {
    Recycled<Renaming> n;
    n->normalizeVariables(TermList(l));
    n->normalizeVariables(l.sort());
    return TypedTermList(n->apply(TermList(l)), n->apply(l.sort()));
  }
}